

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixFileMgr.cpp
# Opt level: O3

XMLFilePos __thiscall
xercesc_4_0::PosixFileMgr::fileSize(PosixFileMgr *this,FileHandle f,MemoryManager *manager)

{
  int iVar1;
  long __off;
  XMLFilePos XVar2;
  XMLPlatformUtilsException *this_00;
  
  if (f == (FileHandle)0x0) {
    this_00 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
    XMLPlatformUtilsException::XMLPlatformUtilsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
               ,0x7d,CPtr_PointerIsZero,manager);
  }
  else {
    __off = ftell((FILE *)f);
    if (__off == -1) {
      this_00 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
      XMLPlatformUtilsException::XMLPlatformUtilsException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
                 ,0x82,File_CouldNotGetCurPos,manager);
    }
    else {
      iVar1 = fseek((FILE *)f,0,2);
      if (iVar1 == 0) {
        XVar2 = ftell((FILE *)f);
        if (XVar2 == 0xffffffffffffffff) {
          this_00 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
          XMLPlatformUtilsException::XMLPlatformUtilsException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
                     ,0x8a,File_CouldNotSeekToEnd,manager);
        }
        else {
          iVar1 = fseek((FILE *)f,__off,0);
          if (iVar1 == 0) {
            return XVar2;
          }
          this_00 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
          XMLPlatformUtilsException::XMLPlatformUtilsException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
                     ,0x8e,File_CouldNotSeekToPos,manager);
        }
      }
      else {
        this_00 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
        XMLPlatformUtilsException::XMLPlatformUtilsException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
                   ,0x86,File_CouldNotSeekToEnd,manager);
      }
    }
  }
  __cxa_throw(this_00,&XMLPlatformUtilsException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLFilePos
PosixFileMgr::fileSize(FileHandle f, MemoryManager* const manager)
{
    if (!f)
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::CPtr_PointerIsZero, manager);
		
    // Get the current position
    long curPos = ftell((FILE*)f);
    if (curPos == -1)
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::File_CouldNotGetCurPos, manager);

    // Seek to the end and save that value for return
    if (fseek((FILE*)f, 0, SEEK_END))
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::File_CouldNotSeekToEnd, manager);

    long retVal = ftell((FILE*)f);
    if (retVal == -1)
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::File_CouldNotSeekToEnd, manager);

    // And put the pointer back
    if (fseek((FILE*)f, curPos, SEEK_SET))
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::File_CouldNotSeekToPos, manager);

    return (XMLFilePos)retVal;
}